

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inttype.cpp
# Opt level: O0

void __thiscall IntegerType::IntegerType(IntegerType *this,ostream *os)

{
  initializer_list<Function> __l;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_00;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_01;
  Function *local_1888;
  pair<const_OperatorChar,_Operator> *local_1778;
  pair<const_OperatorChar,_Operator> *local_1748;
  allocator<Function> local_1673;
  undefined1 local_1672;
  allocator local_1671;
  string local_1670;
  anon_class_16_2_e880815f local_1650;
  ExternalFunction local_1640;
  allocator local_1619;
  string local_1618;
  allocator local_15f1;
  string local_15f0;
  anon_class_16_2_e880815f local_15d0;
  ExternalFunction local_15c0;
  allocator local_1599;
  string local_1598;
  allocator local_1571;
  string local_1570;
  anon_class_8_1_8991fb9c local_1550;
  ExternalFunction local_1548;
  allocator local_1521;
  string local_1520;
  allocator local_14f9;
  string local_14f8;
  anon_class_8_1_8991fb9c local_14d8;
  ExternalFunction local_14d0;
  allocator local_14a9;
  string local_14a8;
  allocator local_1481;
  string local_1480;
  anon_class_8_1_8991fb9c local_1460;
  ExternalFunction local_1458;
  allocator local_1431;
  string local_1430;
  allocator local_1409;
  string local_1408;
  anon_class_8_1_8991fb9c local_13e8;
  ExternalFunction local_13e0;
  allocator local_13b9;
  string local_13b8;
  allocator local_1391;
  string local_1390;
  anon_class_8_1_8991fb9c local_1370;
  ExternalFunction local_1368;
  allocator local_1341;
  string local_1340;
  allocator local_1319;
  string local_1318;
  anon_class_8_1_8991fb9c local_12f8;
  ExternalFunction local_12f0;
  allocator local_12c9;
  string local_12c8;
  allocator local_12a1;
  string local_12a0;
  anon_class_8_1_8991fb9c local_1280;
  ExternalFunction local_1278;
  allocator local_1251;
  string local_1250;
  allocator local_1229;
  string local_1228;
  anon_class_8_1_8991fb9c local_1208;
  ExternalFunction local_1200;
  allocator local_11d9;
  string local_11d8;
  Function *local_11b8;
  Function local_11b0;
  Function local_1130;
  Function local_10b0;
  Function local_1030;
  Function local_fb0;
  Function local_f30;
  Function local_eb0;
  Function local_e30;
  Function local_db0;
  Function local_d30;
  iterator local_cb0;
  size_type local_ca8;
  vector<Function,_std::allocator<Function>_> local_ca0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  local_c83;
  key_equal local_c82;
  hasher local_c81;
  _Any_data local_c80;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  local_c70;
  EnvironmentScope local_c38;
  undefined1 local_bc1;
  OperatorChar local_bc0 [2];
  anon_class_1_0_00000001 local_bb9;
  UnaryOperatorFn local_bb8;
  OperatorChar local_b93;
  Operator local_b90;
  char local_b39;
  OperatorChar local_b38 [2];
  anon_class_1_0_00000001 local_b31;
  UnaryOperatorFn local_b30;
  OperatorChar local_b0b;
  Operator local_b08;
  char local_ab1;
  pair<const_OperatorChar,_Operator> *local_ab0;
  pair<const_OperatorChar,_Operator> local_aa8;
  pair<const_OperatorChar,_Operator> local_a50;
  iterator local_9f8;
  undefined1 local_9f0 [24];
  BinaryOperatorFn local_9d8;
  OperatorChar local_9b3;
  Operator local_9b0;
  char local_959;
  OperatorChar local_958 [2];
  anon_class_1_0_00000001 local_951;
  BinaryOperatorFn local_950;
  OperatorChar local_92b;
  Operator local_928;
  char local_8d1;
  OperatorChar local_8d0 [2];
  anon_class_1_0_00000001 local_8c9;
  BinaryOperatorFn local_8c8;
  OperatorChar local_8a3;
  Operator local_8a0;
  char local_849;
  OperatorChar local_848 [2];
  anon_class_1_0_00000001 local_841;
  BinaryOperatorFn local_840;
  OperatorChar local_81b;
  Operator local_818;
  OperatorChar local_7c3;
  OperatorChar local_7c0 [2];
  anon_class_1_0_00000001 local_7b9;
  BinaryOperatorFn local_7b8;
  OperatorChar local_793;
  Operator local_790;
  OperatorChar local_73b;
  OperatorChar local_738 [2];
  anon_class_1_0_00000001 local_731;
  BinaryOperatorFn local_730;
  OperatorChar local_70b;
  Operator local_708;
  char local_6b1;
  OperatorChar local_6b0 [2];
  anon_class_1_0_00000001 local_6a9;
  BinaryOperatorFn local_6a8;
  OperatorChar local_683;
  Operator local_680;
  char local_629;
  OperatorChar local_628 [2];
  anon_class_1_0_00000001 local_621;
  BinaryOperatorFn local_620;
  OperatorChar local_5fb;
  Operator local_5f8;
  char local_5a1;
  OperatorChar local_5a0 [2];
  anon_class_1_0_00000001 local_599;
  BinaryOperatorFn local_598;
  OperatorChar local_573;
  Operator local_570;
  char local_519;
  OperatorChar local_518 [2];
  anon_class_1_0_00000001 local_511;
  BinaryOperatorFn local_510;
  OperatorChar local_4eb;
  Operator local_4e8;
  char local_495;
  OperatorChar local_494;
  anon_class_8_1_8991fb9c local_490;
  BinaryOperatorFn local_488;
  OperatorChar local_463;
  Operator local_460;
  char local_409;
  pair<const_OperatorChar,_Operator> *local_408;
  pair<const_OperatorChar,_Operator> local_400;
  pair<const_OperatorChar,_Operator> local_3a8;
  pair<const_OperatorChar,_Operator> local_350;
  pair<const_OperatorChar,_Operator> local_2f8;
  pair<const_OperatorChar,_Operator> local_2a0;
  pair<const_OperatorChar,_Operator> local_248;
  pair<const_OperatorChar,_Operator> local_1f0;
  pair<const_OperatorChar,_Operator> local_198;
  pair<const_OperatorChar,_Operator> local_140;
  pair<const_OperatorChar,_Operator> local_e8;
  pair<const_OperatorChar,_Operator> local_90;
  iterator local_38;
  bool local_30;
  char cStack_2f;
  char cStack_2e;
  undefined1 uStack_2d;
  int iStack_2c;
  undefined8 local_18;
  ostream *os_local;
  IntegerType *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  NumberType::NumberType(&this->super_NumberType);
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__IntegerType_001e77d0;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::unordered_map(&this->mBinaryOperators);
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::unordered_map(&this->mUnaryOperators);
  EnvironmentScope::EnvironmentScope(&this->mEnvironment);
  local_9f0[0xf] = 1;
  local_408 = &local_400;
  local_409 = '^';
  OperatorChar::OperatorChar(&local_463,'^');
  local_490.this = this;
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__0,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_488,&local_490);
  local_494.mOp2 = local_463.mOp2;
  local_494.mIsTwoChars = local_463.mIsTwoChars;
  local_494.mOp1 = local_463.mOp1;
  Operator::binary(&local_460,local_494,6,RIGHT,&local_488);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_400,&local_409,&local_460);
  local_495 = '*';
  local_408 = &local_3a8;
  OperatorChar::OperatorChar(&local_4eb,'*');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__1,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_510,&local_511);
  local_518[0].mOp2 = local_4eb.mOp2;
  local_518[0].mIsTwoChars = local_4eb.mIsTwoChars;
  local_518[0].mOp1 = local_4eb.mOp1;
  Operator::binary(&local_4e8,local_518[0],5,LEFT,&local_510);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_3a8,&local_495,&local_4e8);
  local_519 = '/';
  local_408 = &local_350;
  OperatorChar::OperatorChar(&local_573,'/');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__2,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_598,&local_599);
  local_5a0[0].mOp2 = local_573.mOp2;
  local_5a0[0].mIsTwoChars = local_573.mIsTwoChars;
  local_5a0[0].mOp1 = local_573.mOp1;
  Operator::binary(&local_570,local_5a0[0],5,LEFT,&local_598);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_350,&local_519,&local_570);
  local_5a1 = '%';
  local_408 = &local_2f8;
  OperatorChar::OperatorChar(&local_5fb,'%');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__3,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_620,&local_621);
  local_628[0].mOp2 = local_5fb.mOp2;
  local_628[0].mIsTwoChars = local_5fb.mIsTwoChars;
  local_628[0].mOp1 = local_5fb.mOp1;
  Operator::binary(&local_5f8,local_628[0],5,LEFT,&local_620);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_2f8,&local_5a1,&local_5f8);
  local_629 = '+';
  local_408 = &local_2a0;
  OperatorChar::OperatorChar(&local_683,'+');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__4,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_6a8,&local_6a9);
  local_6b0[0].mOp2 = local_683.mOp2;
  local_6b0[0].mIsTwoChars = local_683.mIsTwoChars;
  local_6b0[0].mOp1 = local_683.mOp1;
  Operator::binary(&local_680,local_6b0[0],4,LEFT,&local_6a8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_2a0,&local_629,&local_680);
  local_6b1 = '-';
  local_408 = &local_248;
  OperatorChar::OperatorChar(&local_70b,'-');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__5,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_730,&local_731);
  local_738[0].mOp2 = local_70b.mOp2;
  local_738[0].mIsTwoChars = local_70b.mIsTwoChars;
  local_738[0].mOp1 = local_70b.mOp1;
  Operator::binary(&local_708,local_738[0],4,LEFT,&local_730);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_248,&local_6b1,&local_708);
  local_408 = &local_1f0;
  OperatorChar::OperatorChar(&local_73b,'<','<');
  OperatorChar::OperatorChar(&local_793,'<','<');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__6,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_7b8,&local_7b9);
  local_7c0[0].mOp2 = local_793.mOp2;
  local_7c0[0].mIsTwoChars = local_793.mIsTwoChars;
  local_7c0[0].mOp1 = local_793.mOp1;
  Operator::binary(&local_790,local_7c0[0],3,LEFT,&local_7b8);
  std::pair<const_OperatorChar,_Operator>::pair<OperatorChar,_Operator,_true>
            (&local_1f0,&local_73b,&local_790);
  local_408 = &local_198;
  OperatorChar::OperatorChar(&local_7c3,'>','>');
  OperatorChar::OperatorChar(&local_81b,'>','>');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__7,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_840,&local_841);
  local_848[0].mOp2 = local_81b.mOp2;
  local_848[0].mIsTwoChars = local_81b.mIsTwoChars;
  local_848[0].mOp1 = local_81b.mOp1;
  Operator::binary(&local_818,local_848[0],3,LEFT,&local_840);
  std::pair<const_OperatorChar,_Operator>::pair<OperatorChar,_Operator,_true>
            (&local_198,&local_7c3,&local_818);
  local_849 = '|';
  local_408 = &local_140;
  OperatorChar::OperatorChar(&local_8a3,'|');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__8,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_8c8,&local_8c9);
  local_8d0[0].mOp2 = local_8a3.mOp2;
  local_8d0[0].mIsTwoChars = local_8a3.mIsTwoChars;
  local_8d0[0].mOp1 = local_8a3.mOp1;
  Operator::binary(&local_8a0,local_8d0[0],2,LEFT,&local_8c8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_140,&local_849,&local_8a0);
  local_8d1 = '&';
  local_408 = &local_e8;
  OperatorChar::OperatorChar(&local_92b,'&');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__9,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_950,&local_951);
  local_958[0].mOp2 = local_92b.mOp2;
  local_958[0].mIsTwoChars = local_92b.mIsTwoChars;
  local_958[0].mOp1 = local_92b.mOp1;
  Operator::binary(&local_928,local_958[0],2,LEFT,&local_950);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_e8,&local_8d1,&local_928);
  local_959 = '=';
  local_408 = &local_90;
  OperatorChar::OperatorChar(&local_9b3,'=');
  std::function<ResultValue(ResultValue,ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__10,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_9d8,
             (anon_class_1_0_00000001 *)(local_9f0 + 0x17));
  local_9f0[0x12] = local_9b3.mOp2;
  local_9f0[0x10] = local_9b3.mIsTwoChars;
  local_9f0[0x11] = local_9b3.mOp1;
  Operator::binary(&local_9b0,(OperatorChar)local_9f0._16_3_,1,RIGHT,&local_9d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_90,&local_959,&local_9b0);
  local_9f0[0xf] = 0;
  local_38 = &local_400;
  local_30 = true;
  cStack_2f = '\0';
  cStack_2e = '\0';
  uStack_2d = 0;
  iStack_2c = 0;
  __l_01._M_len = 0xb;
  __l_01._M_array = local_38;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::operator=(&this->mBinaryOperators,__l_01);
  local_1748 = (pair<const_OperatorChar,_Operator> *)&local_38;
  do {
    local_1748 = local_1748 + -1;
    std::pair<const_OperatorChar,_Operator>::~pair(local_1748);
  } while (local_1748 != &local_400);
  Operator::~Operator(&local_9b0);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_9d8);
  Operator::~Operator(&local_928);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_950);
  Operator::~Operator(&local_8a0);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_8c8);
  Operator::~Operator(&local_818);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_840);
  Operator::~Operator(&local_790);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_7b8);
  Operator::~Operator(&local_708);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_730);
  Operator::~Operator(&local_680);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_6a8);
  Operator::~Operator(&local_5f8);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_620);
  Operator::~Operator(&local_570);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_598);
  Operator::~Operator(&local_4e8);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_510);
  Operator::~Operator(&local_460);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_488);
  local_bc1 = 1;
  local_ab0 = &local_aa8;
  local_ab1 = '-';
  OperatorChar::OperatorChar(&local_b0b,'-');
  std::function<ResultValue(ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__11,void>
            ((function<ResultValue(ResultValue)> *)&local_b30,&local_b31);
  local_b38[0].mOp2 = local_b0b.mOp2;
  local_b38[0].mIsTwoChars = local_b0b.mIsTwoChars;
  local_b38[0].mOp1 = local_b0b.mOp1;
  Operator::unary(&local_b08,local_b38[0],7,LEFT,&local_b30);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_aa8,&local_ab1,&local_b08);
  local_b39 = '~';
  local_ab0 = &local_a50;
  OperatorChar::OperatorChar(&local_b93,'~');
  std::function<ResultValue(ResultValue)>::
  function<IntegerType::IntegerType(std::ostream&)::__12,void>
            ((function<ResultValue(ResultValue)> *)&local_bb8,&local_bb9);
  local_bc0[0].mOp2 = local_b93.mOp2;
  local_bc0[0].mIsTwoChars = local_b93.mIsTwoChars;
  local_bc0[0].mOp1 = local_b93.mOp1;
  Operator::unary(&local_b90,local_bc0[0],7,LEFT,&local_bb8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_a50,&local_b39,&local_b90);
  local_bc1 = 0;
  local_9f8 = &local_aa8;
  local_9f0[0] = true;
  local_9f0[1] = '\0';
  local_9f0[2] = '\0';
  local_9f0[3] = 0;
  local_9f0._4_4_ = 0;
  __l_00._M_len = 2;
  __l_00._M_array = local_9f8;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::operator=(&this->mUnaryOperators,__l_00);
  local_1778 = (pair<const_OperatorChar,_Operator> *)&local_9f8;
  do {
    local_1778 = local_1778 + -1;
    std::pair<const_OperatorChar,_Operator>::~pair(local_1778);
  } while (local_1778 != &local_aa8);
  Operator::~Operator(&local_b90);
  std::function<ResultValue_(ResultValue)>::~function(&local_bb8);
  Operator::~Operator(&local_b08);
  std::function<ResultValue_(ResultValue)>::~function(&local_b30);
  std::
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  ::initializer_list((initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
                      *)&local_c80);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  ::allocator(&local_c83);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  ::unordered_map(&local_c70,
                  (initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
                   )local_c80,0,&local_c81,&local_c82,&local_c83);
  local_1672 = 1;
  local_11b8 = &local_11b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11d8,"bitand",&local_11d9);
  local_1208.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__13,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1200,&local_1208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1228,"Computes bitwise AND between x and y.",&local_1229);
  Function::Function(&local_11b0,&local_11d8,2,&local_1200,&local_1228);
  local_11b8 = &local_1130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1250,"bitor",&local_1251);
  local_1280.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__14,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1278,&local_1280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_12a0,"Computes bitwise OR between x and y.",&local_12a1);
  Function::Function(&local_1130,&local_1250,2,&local_1278,&local_12a0);
  local_11b8 = &local_10b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12c8,"bitxor",&local_12c9);
  local_12f8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__15,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_12f0,&local_12f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1318,"Computes bitwise XOR between x and y.",&local_1319);
  Function::Function(&local_10b0,&local_12c8,2,&local_12f0,&local_1318);
  local_11b8 = &local_1030;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1340,"mod",&local_1341);
  local_1370.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__16,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1368,&local_1370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1390,"Computes x mod y.",&local_1391);
  Function::Function(&local_1030,&local_1340,2,&local_1368,&local_1390);
  local_11b8 = &local_fb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13b8,"powerMod",&local_13b9);
  local_13e8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__17,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_13e0,&local_13e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1408,"Computes x^y mod z.",&local_1409);
  Function::Function(&local_fb0,&local_13b8,3,&local_13e0,&local_1408);
  local_11b8 = &local_f30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1430,"gcd",&local_1431);
  local_1460.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__18,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1458,&local_1460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1480,"Computes the greatest common divisor between x and y.",
             &local_1481);
  Function::Function(&local_f30,&local_1430,2,&local_1458,&local_1480);
  local_11b8 = &local_eb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14a8,"modInv",&local_14a9);
  local_14d8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__19,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_14d0,&local_14d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14f8,"Tries to find the multiplicative inverse of x mod y.",
             &local_14f9);
  Function::Function(&local_eb0,&local_14a8,2,&local_14d0,&local_14f8);
  local_11b8 = &local_e30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1520,"sqrt",&local_1521);
  local_1550.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__20,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1548,&local_1550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1570,"Returns the integer part of the square root of x.",&local_1571);
  Function::Function(&local_e30,&local_1520,1,&local_1548,&local_1570);
  local_11b8 = &local_db0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1598,"twocomp",&local_1599);
  local_15d0.os = (ostream *)local_18;
  local_15d0.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__21,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_15c0,&local_15d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_15f0,"Prints the given value in two-complements form.",&local_15f1);
  Function::Function(&local_db0,&local_1598,1,&local_15c0,&local_15f0);
  local_11b8 = &local_d30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1618,"twocomp",&local_1619);
  local_1650.os = (ostream *)local_18;
  local_1650.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<IntegerType::IntegerType(std::ostream&)::__22,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1640,&local_1650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1670,"Prints the value x in two-complements form of size y.",
             &local_1671);
  Function::Function(&local_d30,&local_1618,2,&local_1640,&local_1670);
  local_1672 = 0;
  local_cb0 = &local_11b0;
  local_ca8 = 10;
  std::allocator<Function>::allocator(&local_1673);
  __l._M_len = local_ca8;
  __l._M_array = local_cb0;
  std::vector<Function,_std::allocator<Function>_>::vector(&local_ca0,__l,&local_1673);
  EnvironmentScope::EnvironmentScope(&local_c38,&local_c70,&local_ca0);
  EnvironmentScope::operator=(&this->mEnvironment,&local_c38);
  EnvironmentScope::~EnvironmentScope(&local_c38);
  std::vector<Function,_std::allocator<Function>_>::~vector(&local_ca0);
  std::allocator<Function>::~allocator(&local_1673);
  local_1888 = (Function *)&local_cb0;
  do {
    local_1888 = local_1888 + -1;
    Function::~Function(local_1888);
  } while (local_1888 != &local_11b0);
  std::__cxx11::string::~string((string *)&local_1670);
  std::allocator<char>::~allocator((allocator<char> *)&local_1671);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1640);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_15c0);
  std::__cxx11::string::~string((string *)&local_1598);
  std::allocator<char>::~allocator((allocator<char> *)&local_1599);
  std::__cxx11::string::~string((string *)&local_1570);
  std::allocator<char>::~allocator((allocator<char> *)&local_1571);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1548);
  std::__cxx11::string::~string((string *)&local_1520);
  std::allocator<char>::~allocator((allocator<char> *)&local_1521);
  std::__cxx11::string::~string((string *)&local_14f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f9);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_14d0);
  std::__cxx11::string::~string((string *)&local_14a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14a9);
  std::__cxx11::string::~string((string *)&local_1480);
  std::allocator<char>::~allocator((allocator<char> *)&local_1481);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1458);
  std::__cxx11::string::~string((string *)&local_1430);
  std::allocator<char>::~allocator((allocator<char> *)&local_1431);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator((allocator<char> *)&local_1409);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_13e0);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13b9);
  std::__cxx11::string::~string((string *)&local_1390);
  std::allocator<char>::~allocator((allocator<char> *)&local_1391);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1368);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator((allocator<char> *)&local_1341);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator((allocator<char> *)&local_1319);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_12f0);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1278);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator((allocator<char> *)&local_1251);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1200);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  ::~unordered_map(&local_c70);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  ::~allocator(&local_c83);
  return;
}

Assistant:

IntegerType::IntegerType(std::ostream& os) {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return power(lhs.intValue(), rhs.intValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() * rhs.intValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() / rhs.intValue();
		}) },
		{ '%', Operator::binary('%', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() % rhs.intValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() + rhs.intValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() - rhs.intValue();
		}) },
		{ OperatorChar('<', '<'), Operator::binary(OperatorChar('<', '<'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() << rhs.intValue();
		}) },
		{ OperatorChar('>', '>'), Operator::binary(OperatorChar('>', '>'), 3, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() >> rhs.intValue();
		}) },
		{ '|', Operator::binary('|', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() | rhs.intValue();
		}) },
		{ '&', Operator::binary('&', 2, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.intValue() & rhs.intValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.intValue();
		}) },
		{ '~', Operator::unary('~', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return ~op.intValue();
		}) },
	};

	mEnvironment = EnvironmentScope(Variables({}), {
		Function("bitand", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise AND between x and y."),
		Function("bitor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() | args.at(1).intValue());
		}, "Computes bitwise OR between x and y."),
		Function("bitxor", 2, [this](FunctionArguments args) {
			return ResultValue(args.at(0).intValue() ^ args.at(1).intValue());
		}, "Computes bitwise XOR between x and y."),
		Function("mod", 2, [this](FunctionArguments args) {
			std::int64_t result = args.at(0).intValue() % args.at(1).intValue();

			if (result < 0) {
				result += args.at(1).intValue();
			}

			return ResultValue(result);
		}, "Computes x mod y."),
		Function("powerMod", 3, [this](FunctionArguments args) {
			return ResultValue(
				powerMod(args.at(0).intValue(),
						 args.at(1).intValue(),
						 args.at(2).intValue()));
		}, "Computes x^y mod z."),
		Function("gcd", 2, [this](FunctionArguments args) {
			return ResultValue(gcd(args.at(0).intValue(), args.at(1).intValue()));
		}, "Computes the greatest common divisor between x and y."),
		Function("modInv", 2, [this](FunctionArguments args) {
			if (gcd(args[0].intValue(), args[1].intValue()) == 1) {
				return ResultValue(
					modularMultInverse(
						args.at(0).intValue(),
						args.at(1).intValue()));
			} else {
				throw std::runtime_error(
					std::to_string(args[0].intValue()) + " is not invertible mod " + std::to_string(args[1].intValue()) + ".");
			}
		}, "Tries to find the multiplicative inverse of x mod y."),
		Function("sqrt", 1, [this](FunctionArguments args) {
			if (args[0].intValue() >= 0) {
				return ResultValue(sqrt(args[0].intValue()));
			} else {
				throw std::runtime_error("The value must be >= 0.");
			}
		}, "Returns the integer part of the square root of x."),
		Function("twocomp", 1, [this, &os](FunctionArguments args) {
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue()) << std::endl;
			return ResultValue();
		}, "Prints the given value in two-complements form."),
		Function("twocomp", 2, [this, &os](FunctionArguments args) {
			int size = (int)args.at(1).intValue();
			os << "0b" << NumberHelpers::toBaseBinary(args.at(0).intValue(), size) << std::endl;
			return ResultValue();
		}, "Prints the value x in two-complements form of size y."),
	});
}